

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O0

void __thiscall ExeCommander::initCommands(ExeCommander *this)

{
  Command *pCVar1;
  ConvertAddrCommand *pCVar2;
  FetchCommand *pFVar3;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined1 local_33a;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2ea;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_29a;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ExeCommander *local_10;
  ExeCommander *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"info",&local_31);
  pCVar1 = (Command *)operator_new(0x28);
  local_6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Exe Info",&local_69);
  ExeInfoCommand::ExeInfoCommand((ExeInfoCommand *)pCVar1,&local_68);
  local_6a = 0;
  Commander::addCommand(&this->super_Commander,&local_30,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"r-v",&local_91);
  pCVar2 = (ConvertAddrCommand *)operator_new(0x30);
  local_ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Convert: RAW -> RVA",&local_b9);
  ConvertAddrCommand::ConvertAddrCommand(pCVar2,RAW,RVA,&local_b8);
  local_ba = 0;
  Commander::addCommand(&this->super_Commander,&local_90,(Command *)pCVar2,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"v-r",&local_e1);
  pCVar2 = (ConvertAddrCommand *)operator_new(0x30);
  local_10a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Convert: RVA -> RAW",&local_109);
  ConvertAddrCommand::ConvertAddrCommand(pCVar2,RVA,RAW,&local_108);
  local_10a = 0;
  Commander::addCommand(&this->super_Commander,&local_e0,(Command *)pCVar2,true);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"printc",&local_131);
  pFVar3 = (FetchCommand *)operator_new(0x30);
  local_15a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Print content by Raw address",&local_159);
  FetchCommand::FetchCommand(pFVar3,false,RAW,&local_158);
  local_15a = 0;
  Commander::addCommand(&this->super_Commander,&local_130,(Command *)pFVar3,true);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"printx",&local_181);
  pFVar3 = (FetchCommand *)operator_new(0x30);
  local_1aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Print content by Raw address - HEX",&local_1a9);
  FetchCommand::FetchCommand(pFVar3,true,RAW,&local_1a8);
  local_1aa = 0;
  Commander::addCommand(&this->super_Commander,&local_180,(Command *)pFVar3,true);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"cl",&local_1d1);
  pCVar1 = (Command *)operator_new(0x30);
  local_1fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Clear chosen wrapper Content",&local_1f9);
  ClearWrapperCommand::ClearWrapperCommand
            ((ClearWrapperCommand *)pCVar1,&local_1f8,0xffffffffffffffff);
  local_1fa = 0;
  Commander::addCommand(&this->super_Commander,&local_1d0,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"fdump",&local_221);
  pCVar1 = (Command *)operator_new(0x30);
  local_24a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Dump chosen wrapper Content into a file",&local_249);
  DumpWrapperToFileCommand::DumpWrapperToFileCommand
            ((DumpWrapperToFileCommand *)pCVar1,&local_248,0xffffffffffffffff);
  local_24a = 0;
  Commander::addCommand(&this->super_Commander,&local_220,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"winfo",&local_271);
  pCVar1 = (Command *)operator_new(0x30);
  local_29a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Dump chosen wrapper info",&local_299);
  DumpWrapperCommand::DumpWrapperCommand((DumpWrapperCommand *)pCVar1,&local_298,0xffffffffffffffff)
  ;
  local_29a = 0;
  Commander::addCommand(&this->super_Commander,&local_270,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"einfo",&local_2c1);
  pCVar1 = (Command *)operator_new(0x30);
  local_2ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"Dump wrapper entries",&local_2e9);
  DumpWrapperEntriesCommand::DumpWrapperEntriesCommand
            ((DumpWrapperEntriesCommand *)pCVar1,&local_2e8,0xffffffffffffffff);
  local_2ea = 0;
  Commander::addCommand(&this->super_Commander,&local_2c0,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"e_add",&local_311);
  pCVar1 = (Command *)operator_new(0x30);
  local_33a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"Add entry to a wrapper",&local_339);
  AddEntryCommand::AddEntryCommand((AddEntryCommand *)pCVar1,&local_338,0xffffffffffffffff);
  local_33a = 0;
  Commander::addCommand(&this->super_Commander,&local_310,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"save",&local_361);
  pCVar1 = (Command *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Save exe to file",&local_389);
  SaveExeToFileCommand::SaveExeToFileCommand((SaveExeToFileCommand *)pCVar1,&local_388);
  Commander::addCommand(&this->super_Commander,&local_360,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  return;
}

Assistant:

void ExeCommander::initCommands()
{
    this->addCommand("info", new ExeInfoCommand());

    this->addCommand("r-v", new ConvertAddrCommand(Executable::RAW, Executable::RVA, "Convert: RAW -> RVA"));
    this->addCommand("v-r", new ConvertAddrCommand(Executable::RVA, Executable::RAW, "Convert: RVA -> RAW"));

    this->addCommand("printc", new FetchCommand(false, Executable::RAW, "Print content by Raw address"));
    //this->addCommand("cV", new FetchCommand(false, Executable::RVA, "Fetch content by Virtual address"));

    this->addCommand("printx", new FetchCommand(true, Executable::RAW, "Print content by Raw address - HEX"));
    //this->addCommand("hV", new FetchCommand(true, Executable::RVA, "Fetch content by Virtual address - HEX"));

    this->addCommand("cl", new ClearWrapperCommand("Clear chosen wrapper Content"));
    this->addCommand("fdump", new DumpWrapperToFileCommand("Dump chosen wrapper Content into a file"));
    this->addCommand("winfo", new DumpWrapperCommand("Dump chosen wrapper info"));
    this->addCommand("einfo", new DumpWrapperEntriesCommand("Dump wrapper entries"));

    this->addCommand("e_add", new AddEntryCommand("Add entry to a wrapper"));
    this->addCommand("save", new SaveExeToFileCommand());
}